

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderAdjacencyTests::createGridTriangleStrip
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  AdjacencyGridPoint *pAVar3;
  AdjacencyGridTriangle *pAVar4;
  AdjacencyGridTriangle *trianglePtr;
  uint triangleIndex;
  AdjacencyGridPoint *pointPtr;
  uint n;
  int nVerticesPerTriangleStripPrimitive;
  AdjacencyTestData *test_data_local;
  GeometryShaderAdjacencyTests *this_local;
  
  (test_data->m_grid->m_triangle_strip).m_n_points = test_data->m_grid->m_n_triangles * 6;
  auVar1 = ZEXT416((test_data->m_grid->m_triangle_strip).m_n_points) * ZEXT816(0xc);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pAVar3 = (AdjacencyGridPoint *)operator_new__(uVar2);
  (test_data->m_grid->m_triangle_strip).m_points = pAVar3;
  memset((test_data->m_grid->m_triangle_strip).m_points,0,
         (ulong)(test_data->m_grid->m_triangle_strip).m_n_points * 0xc);
  for (pointPtr._0_4_ = 0; (uint)pointPtr < (test_data->m_grid->m_triangle_strip).m_n_points;
      pointPtr._0_4_ = (uint)pointPtr + 1) {
    pAVar3 = (test_data->m_grid->m_triangle_strip).m_points + (uint)pointPtr;
    pAVar4 = test_data->m_grid->m_triangles + (uint)pointPtr / 6;
    pAVar3->index = (uint)pointPtr;
    switch((uint)pointPtr % 6) {
    case 0:
      pAVar3->x = pAVar4->m_vertex_x->x;
      pAVar3->y = pAVar4->m_vertex_x->y;
      break;
    case 1:
      pAVar3->x = pAVar4->m_vertex_x_adjacent->x;
      pAVar3->y = pAVar4->m_vertex_x_adjacent->y;
      break;
    case 2:
      pAVar3->x = pAVar4->m_vertex_y->x;
      pAVar3->y = pAVar4->m_vertex_y->y;
      break;
    case 3:
      pAVar3->x = pAVar4->m_vertex_y_adjacent->x;
      pAVar3->y = pAVar4->m_vertex_y_adjacent->y;
      break;
    case 4:
      pAVar3->x = pAVar4->m_vertex_z->x;
      pAVar3->y = pAVar4->m_vertex_z->y;
      break;
    case 5:
      pAVar3->x = pAVar4->m_vertex_z_adjacent->x;
      pAVar3->y = pAVar4->m_vertex_z_adjacent->y;
    }
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::createGridTriangleStrip(AdjacencyTestData& test_data)
{
	/* For simplicity, reuse adjacency data we have already defined for single triangles.
	 * This does not make a correct topology, but our point is to verify that shaders
	 * are fed valid values (as per spec), not to confirm rendering works correctly.
	 */
	const int nVerticesPerTriangleStripPrimitive = 6;

	test_data.m_grid->m_triangle_strip.m_n_points =
		test_data.m_grid->m_n_triangles * nVerticesPerTriangleStripPrimitive;
	test_data.m_grid->m_triangle_strip.m_points = new AdjacencyGridPoint[test_data.m_grid->m_triangle_strip.m_n_points];

	memset(test_data.m_grid->m_triangle_strip.m_points, 0,
		   sizeof(AdjacencyGridPoint) * test_data.m_grid->m_triangle_strip.m_n_points);

	for (unsigned int n = 0; n < test_data.m_grid->m_triangle_strip.m_n_points; ++n)
	{
		AdjacencyGridPoint*	pointPtr		 = test_data.m_grid->m_triangle_strip.m_points + n;
		unsigned int		   triangleIndex = n / nVerticesPerTriangleStripPrimitive;
		AdjacencyGridTriangle* trianglePtr   = test_data.m_grid->m_triangles + triangleIndex;

		pointPtr->index = n;

		switch (n % nVerticesPerTriangleStripPrimitive)
		{
		case 0:
			pointPtr->x = trianglePtr->m_vertex_x->x;
			pointPtr->y = trianglePtr->m_vertex_x->y;
			break;
		case 1:
			pointPtr->x = trianglePtr->m_vertex_x_adjacent->x;
			pointPtr->y = trianglePtr->m_vertex_x_adjacent->y;
			break;
		case 2:
			pointPtr->x = trianglePtr->m_vertex_y->x;
			pointPtr->y = trianglePtr->m_vertex_y->y;
			break;
		case 3:
			pointPtr->x = trianglePtr->m_vertex_y_adjacent->x;
			pointPtr->y = trianglePtr->m_vertex_y_adjacent->y;
			break;
		case 4:
			pointPtr->x = trianglePtr->m_vertex_z->x;
			pointPtr->y = trianglePtr->m_vertex_z->y;
			break;
		case 5:
			pointPtr->x = trianglePtr->m_vertex_z_adjacent->x;
			pointPtr->y = trianglePtr->m_vertex_z_adjacent->y;
			break;
		}
	} /* for (all points) */
}